

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapsingHeader(char *label,bool *p_open,ImGuiTreeNodeFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  byte *in_RSI;
  float _x;
  float button_y;
  float button_x;
  float button_size;
  ImGuiItemHoveredDataBackup last_item_backup;
  ImGuiContext *g;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImVec2 *in_stack_000000a8;
  ImGuiID in_stack_000000b0;
  char *in_stack_000000f8;
  char *in_stack_00000100;
  ImGuiTreeNodeFlags in_stack_0000010c;
  ImGuiID in_stack_00000110;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  float in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffffa0;
  ImVec2 in_stack_ffffffffffffffa8;
  ImVec2 in_stack_ffffffffffffffb0;
  bool local_1;
  
  pIVar4 = GetCurrentWindow();
  if ((pIVar4->SkipItems & 1U) == 0) {
    if ((in_RSI == (byte *)0x0) || ((*in_RSI & 1) != 0)) {
      ImGuiWindow::GetID((ImGuiWindow *)in_stack_ffffffffffffffb0,(char *)in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa0);
      local_1 = TreeNodeBehavior(in_stack_00000110,in_stack_0000010c,in_stack_00000100,
                                 in_stack_000000f8);
      pIVar1 = GImGui;
      if (in_RSI != (byte *)0x0) {
        ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup
                  ((ImGuiItemHoveredDataBackup *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        fVar3 = -(pIVar1->Style).FramePadding.x;
        _x = ImMax<float>((pIVar4->DC).LastItemRect.Min.x,
                          (fVar3 + fVar3 + (pIVar4->DC).LastItemRect.Max.x) - pIVar1->FontSize);
        fVar3 = (pIVar4->DC).LastItemRect.Min.y;
        ImGuiWindow::GetID((ImGuiWindow *)CONCAT44(fVar3,in_stack_ffffffffffffff90),
                           (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff8c,_x,fVar3);
        bVar2 = CloseButton(in_stack_000000b0,in_stack_000000a8);
        if (bVar2) {
          *in_RSI = 0;
        }
        ImGuiItemHoveredDataBackup::Restore((ImGuiItemHoveredDataBackup *)&stack0xffffffffffffffa0);
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_open, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_open && !*p_open)
        return false;

    ImGuiID id = window->GetID(label);
    flags |= ImGuiTreeNodeFlags_CollapsingHeader;
    if (p_open)
        flags |= ImGuiTreeNodeFlags_AllowItemOverlap | ImGuiTreeNodeFlags_ClipLabelForTrailingButton;
    bool is_open = TreeNodeBehavior(id, flags, label);
    if (p_open)
    {
        // Create a small overlapping close button
        // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        // FIXME: CloseButton can overlap into text, need find a way to clip the text somehow.
        ImGuiContext& g = *GImGui;
        ImGuiItemHoveredDataBackup last_item_backup;
        float button_size = g.FontSize;
        float button_x = ImMax(window->DC.LastItemRect.Min.x, window->DC.LastItemRect.Max.x - g.Style.FramePadding.x * 2.0f - button_size);
        float button_y = window->DC.LastItemRect.Min.y;
        if (CloseButton(window->GetID((void*)((intptr_t)id + 1)), ImVec2(button_x, button_y)))
            *p_open = false;
        last_item_backup.Restore();
    }

    return is_open;
}